

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

Diagnostic * __thiscall
slang::ast::Scope::addDiag(Scope *this,DiagCode code,SourceRange sourceRange)

{
  SourceRange range;
  Diagnostic *pDVar1;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  undefined8 in_RDI;
  Diagnostic diag;
  Symbol *in_stack_fffffffffffffe98;
  Diagnostic *in_stack_fffffffffffffea0;
  Diagnostic *this_00;
  SourceLocation in_stack_fffffffffffffea8;
  undefined4 uVar2;
  DiagCode code_00;
  Diagnostic local_138;
  SourceLocation local_b8;
  Compilation *in_stack_ffffffffffffff58;
  SourceRange local_18;
  
  uVar2 = (undefined4)in_RDI;
  code_00 = SUB84((ulong)in_RDI >> 0x20,0);
  local_18.startLoc = in_RDX;
  local_18.endLoc = in_RCX;
  SourceRange::start(&local_18);
  Diagnostic::Diagnostic
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,code_00,in_stack_fffffffffffffea8);
  local_b8 = local_18.startLoc;
  range.endLoc._0_4_ = uVar2;
  range.startLoc = in_stack_fffffffffffffea8;
  range.endLoc._4_2_ = code_00.subsystem;
  range.endLoc._6_2_ = code_00.code;
  Diagnostic::operator<<(in_stack_fffffffffffffea0,range);
  this_00 = &local_138;
  Diagnostic::Diagnostic(this_00,*(Diagnostic **)CONCAT44(code_00,uVar2));
  pDVar1 = Compilation::addDiag(in_stack_ffffffffffffff58,(Diagnostic *)local_18.endLoc);
  Diagnostic::~Diagnostic(this_00);
  Diagnostic::~Diagnostic(this_00);
  return pDVar1;
}

Assistant:

Diagnostic& Scope::addDiag(DiagCode code, SourceRange sourceRange) const {
    Diagnostic diag(*thisSym, code, sourceRange.start());
    diag << sourceRange;
    return compilation.addDiag(std::move(diag));
}